

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.h
# Opt level: O0

void __thiscall
uWS::TemplatedApp<false>::TemplatedApp
          (TemplatedApp<false> *this,us_socket_context_options_t options)

{
  us_socket_context_options_t options_00;
  HttpContext<false> *pHVar1;
  undefined8 *in_RDI;
  undefined1 in_stack_00000000 [16];
  Loop *in_stack_00000018;
  undefined8 in_stack_00000030;
  void *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffffe8 [16];
  undefined8 *puVar2;
  
  puVar2 = in_RDI;
  std::
  vector<uWS::WebSocketContext<false,_true>_*,_std::allocator<uWS::WebSocketContext<false,_true>_*>_>
  ::vector((vector<uWS::WebSocketContext<false,_true>_*,_std::allocator<uWS::WebSocketContext<false,_true>_*>_>
            *)0x215127);
  Loop::get(in_stack_ffffffffffffff70);
  options_00.cert_file_name = (char *)in_stack_ffffffffffffffe8._0_8_;
  options_00.passphrase = (char *)in_stack_ffffffffffffffe8._8_8_;
  options_00.key_file_name = (char *)in_stack_00000030;
  options_00.dh_params_file_name = (char *)puVar2;
  options_00._32_16_ = in_stack_00000000;
  pHVar1 = HttpContext<false>::create(in_stack_00000018,options_00);
  *in_RDI = pHVar1;
  return;
}

Assistant:

TemplatedApp(us_socket_context_options_t options = {}) {
        httpContext = uWS::HttpContext<SSL>::create(uWS::Loop::get(), options);
    }